

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

void __thiscall
pbrt::Bounds3<float>::BoundingSphere(Bounds3<float> *this,Point3<float> *center,Float *radius)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar6;
  float fVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar4 = (this->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = (this->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar5 = (this->pMax).super_Tuple3<pbrt::Point3,_float>.x;
  uVar8 = (this->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  auVar13._0_4_ = (float)uVar4 + (float)uVar5;
  auVar13._4_4_ = (float)uVar7 + (float)uVar8;
  auVar13._8_8_ = 0;
  auVar10._8_4_ = 0x3f000000;
  auVar10._0_8_ = 0x3f0000003f000000;
  auVar10._12_4_ = 0x3f000000;
  auVar10 = vmulps_avx512vl(auVar13,auVar10);
  fVar9 = ((this->pMin).super_Tuple3<pbrt::Point3,_float>.z +
          (this->pMax).super_Tuple3<pbrt::Point3,_float>.z) * 0.5;
  FVar11 = 0.0;
  uVar6 = vmovlps_avx(auVar10);
  (center->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar6;
  (center->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar6 >> 0x20);
  (center->super_Tuple3<pbrt::Point3,_float>).z = fVar9;
  if (((this->pMin).super_Tuple3<pbrt::Point3,_float>.x <= auVar10._0_4_) &&
     (fVar1 = (this->pMax).super_Tuple3<pbrt::Point3,_float>.x, auVar10._0_4_ <= fVar1)) {
    auVar13 = vmovshdup_avx(auVar10);
    if (((this->pMin).super_Tuple3<pbrt::Point3,_float>.y <= auVar13._0_4_) &&
       (((fVar2 = (this->pMax).super_Tuple3<pbrt::Point3,_float>.y, auVar13._0_4_ <= fVar2 &&
         ((this->pMin).super_Tuple3<pbrt::Point3,_float>.z <= fVar9)) &&
        (fVar3 = (this->pMax).super_Tuple3<pbrt::Point3,_float>.z, fVar9 <= fVar3)))) {
      auVar13 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
      auVar10 = vsubps_avx(auVar10,auVar13);
      fVar9 = fVar9 - fVar3;
      auVar12._0_4_ = auVar10._0_4_ * auVar10._0_4_;
      auVar12._4_4_ = auVar10._4_4_ * auVar10._4_4_;
      auVar12._8_4_ = auVar10._8_4_ * auVar10._8_4_;
      auVar12._12_4_ = auVar10._12_4_ * auVar10._12_4_;
      auVar10 = vhaddps_avx(auVar12,auVar12);
      auVar10 = ZEXT416((uint)(auVar10._0_4_ + fVar9 * fVar9));
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      FVar11 = auVar10._0_4_;
    }
  }
  *radius = FVar11;
  return;
}

Assistant:

PBRT_CPU_GPU auto operator+(const Child<U> &c) const -> Child<decltype(T{} + U{})> {
        DCHECK(!c.HasNaN());
        return {x + c.x, y + c.y, z + c.z};
    }